

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::getTensorViscTerms
          (Diffusion *this,MultiFab *visc_terms,Real time,MultiFab **beta,MultiFab *betaCC,
          int betaComp)

{
  NavierStokesBase *pNVar1;
  MultiFab *pMVar2;
  EBFArrayBoxFactory *pEVar3;
  int i;
  long lVar4;
  MLEBABecLap *this_00;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *this_01;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_03;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_04;
  initializer_list<amrex::MultiFab_*> __l_05;
  initializer_list<amrex::MultiFab_*> __l_06;
  Array<LinOpBCType,_3> mlmg_lobc [3];
  Array<LinOpBCType,_3> mlmg_hibc [3];
  int allthere;
  MLMG mlmg;
  MultiFab visc_tmp;
  MLEBTensorOp tensorop;
  MultiFab s_tmp;
  allocator_type local_a44;
  allocator_type local_a43;
  allocator_type local_a42;
  allocator_type local_a41;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_a40;
  Real local_a28;
  int local_a1c;
  DistributionMapping local_a18;
  vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  local_a08;
  EBFArrayBoxFactory *local_9f0;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_9e8;
  Real local_9d0;
  int local_9c8;
  undefined1 local_9b8 [20];
  int local_9a4;
  undefined8 local_9a0;
  undefined4 local_998;
  MultiFab *local_988;
  int local_97c;
  LPInfo local_978;
  undefined1 local_958 [32];
  undefined4 uStack_938;
  undefined4 uStack_934;
  MLMG local_8f0;
  FabArray<amrex::FArrayBox> local_758;
  undefined1 local_5d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c8;
  int local_5ac;
  MultiFab local_1b0;
  
  local_a28 = time;
  local_a1c = betaComp;
  checkBeta(this,beta,&local_97c);
  if ((visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < 3) {
    amrex::Abort_host(
                     "Diffusion::getTensorViscTerms(): visc_terms needs at least BL_SPACEDIM components"
                     );
  }
  pMVar2 = amrex::AmrLevel::get_data(&this->navier_stokes->super_AmrLevel,0,local_a28);
  if (*is_diffusive.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start == 0)
  {
    local_5d8._4_4_ =
         (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    local_5d8._0_4_ = local_5d8._4_4_;
    local_5d8._8_4_ = local_5d8._4_4_;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&visc_terms->super_FabArray<amrex::FArrayBox>,0.0,0,3,(IntVect *)local_5d8);
  }
  else {
    local_5d8._0_8_ = (_func_int **)0x1;
    local_5d8._8_8_ = (Arena *)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_758,this->grids,this->dmap,3,2,(MFInfo *)local_5d8,
               (this->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5c8);
    local_5d8._0_8_ = (_func_int **)0x1;
    local_5d8._8_8_ = (Arena *)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&local_1b0,this->grids,this->dmap,3,1,(MFInfo *)local_5d8,
               (this->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5c8);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&local_758,0.0,0,local_758.super_FabArrayBase.n_comp,
               &local_758.super_FabArrayBase.n_grow);
    amrex::MultiFab::Copy(&local_1b0,pMVar2,0,0,3,0);
    local_978.do_semicoarsening = false;
    local_978.agg_grid_size = -1;
    local_978.con_grid_size = -1;
    local_978.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_978.has_metric_term = true;
    local_978.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_978.max_coarsening_level = 0;
    local_978.max_semicoarsening_level = 0;
    local_978.semicoarsening_direction = -1;
    local_978.hidden_direction = -1;
    pNVar1 = this->navier_stokes;
    local_988 = betaCC;
    pEVar3 = (EBFArrayBoxFactory *)
             __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (pEVar3 == (EBFArrayBoxFactory *)0x0) {
      __cxa_bad_cast();
    }
    memcpy((iterator)&local_8f0,&(pNVar1->super_AmrLevel).geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_8f0;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              (&local_9e8,__l,&local_a44);
    amrex::BoxArray::BoxArray((BoxArray *)local_958,this->grids);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_958;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_9b8,__l_00,
               &local_a41);
    local_a18.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->dmap->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a18.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->dmap->m_ref).
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_a18.m_ref.
        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a18.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_a18.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a18.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_a18.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    __l_01._M_len = 1;
    __l_01._M_array = &local_a18;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              (&local_a40,__l_01,&local_a42);
    __l_02._M_len = 1;
    __l_02._M_array = &local_9f0;
    local_9f0 = pEVar3;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector(&local_a08,__l_02,&local_a43);
    a_geom = &local_9e8;
    amrex::MLEBTensorOp::MLEBTensorOp
              ((MLEBTensorOp *)local_5d8,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)a_geom,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_9b8,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_a40,&local_978,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_a08);
    if (local_a08.
        super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a08.
                      super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a08.
                            super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a08.
                            super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&local_a40);
    if (local_a18.m_ref.
        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a18.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_9b8;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(this_01);
    amrex::BoxArray::~BoxArray((BoxArray *)local_958);
    if (local_9e8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9e8.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT44(local_9e8.
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_9e8.
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                      (long)local_9e8.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_5ac = tensor_max_order;
    lVar4 = 0;
    do {
      setDomainBC(this,(array<amrex::LinOpBCType,_3UL> *)a_geom,
                  (array<amrex::LinOpBCType,_3UL> *)this_01,(int)lVar4);
      lVar4 = lVar4 + 1;
      this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                ((long)&(this_01->
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                        _M_impl.super__Vector_impl_data._M_finish + 4);
      a_geom = (vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               ((long)&(((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        &(a_geom->
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                         _M_impl)->_M_impl).super__Vector_impl_data._M_finish + 4);
    } while (lVar4 != 3);
    local_8f0.do_fixed_number_of_iters =
         (BATType)local_9e8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_8f0._0_8_ =
         local_9e8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_8f0.nuf =
         local_9e8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    local_8f0._24_8_ = local_9d0;
    local_8f0.bottom_solver = local_9c8;
    __l_03._M_len = 3;
    __l_03._M_array = (iterator)&local_8f0;
    std::
    vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_a40,__l_03,(allocator_type *)&local_a18);
    local_958._8_4_ = local_9b8._8_4_;
    local_958._0_8_ = local_9b8._0_8_;
    local_958._12_4_ = (undefined4)local_9b8._12_8_;
    local_958._16_4_ = SUB84(local_9b8._12_8_,4);
    local_958._20_4_ = local_9a4;
    local_958._24_8_ = local_9a0;
    uStack_938 = local_998;
    __l_04._M_len = 3;
    __l_04._M_array = (iterator)local_958;
    std::
    vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_a08,__l_04,(allocator_type *)&local_9f0);
    pMVar2 = local_988;
    amrex::MLLinOp::setDomainBC
              ((MLLinOp *)local_5d8,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)&local_a40,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)&local_a08);
    if (local_a08.
        super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a08.
                      super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a08.
                            super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a08.
                            super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a40.
        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a40.
                      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a40.
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a40.
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    amrex::MultiFab::MultiFab((MultiFab *)&local_8f0);
    if (0 < this->level) {
      pNVar1 = this->coarser->navier_stokes;
      local_958._0_8_ = (pointer)0x1;
      local_958._8_4_ = 0;
      local_958._12_4_ = 0;
      local_958._16_4_ = 0;
      local_958._20_4_ = 0;
      local_958._24_8_ = 0;
      _uStack_938 = 0;
      amrex::MultiFab::define
                ((MultiFab *)&local_8f0,&(pNVar1->super_AmrLevel).grids,
                 &(pNVar1->super_AmrLevel).dmap,3,1,(MFInfo *)local_958,
                 (pNVar1->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_958 + 0x10));
      amrex::AmrLevel::FillPatch(&pNVar1->super_AmrLevel,(MultiFab *)&local_8f0,1,local_a28,0,0,3,0)
      ;
      amrex::MLLinOp::setCoarseFineBC
                ((MLLinOp *)local_5d8,(MultiFab *)&local_8f0,(this->crse_ratio).vect[0]);
    }
    amrex::AmrLevel::FillPatch(&this->navier_stokes->super_AmrLevel,&local_1b0,1,local_a28,0,0,3,0);
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)local_5d8,0,&local_1b0,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0
              );
    amrex::MultiFab::~MultiFab((MultiFab *)&local_8f0);
    this_00 = (MLEBABecLap *)local_5d8;
    amrex::MLEBABecLap::setScalars(this_00,0.0,-1.0);
    setViscosity((Diffusion *)this_00,(MLEBTensorOp *)local_5d8,beta,local_a1c,pMVar2);
    amrex::MLMG::MLMG(&local_8f0,(MLLinOp *)local_5d8);
    local_8f0.max_fmg_iters = (anonymous_namespace)::max_fmg_iter;
    local_8f0.verbose = 10;
    local_8f0.bottom_verbose = 10;
    local_a08.
    super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_758;
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&local_a08;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_958,__l_05,
               (allocator_type *)&local_9f0);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_a18;
    local_a18.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&local_1b0;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a40,__l_06,
               (allocator_type *)&local_a44);
    amrex::MLMG::apply(&local_8f0,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_958,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a40);
    if (local_a40.
        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a40.
                      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a40.
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a40.
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_958._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_958._0_8_,
                      CONCAT44(local_958._20_4_,local_958._16_4_) - local_958._0_8_);
    }
    amrex::MLMG::~MLMG(&local_8f0);
    amrex::MLEBTensorOp::~MLEBTensorOp((MLEBTensorOp *)local_5d8);
    lVar4 = __dynamic_cast((this->navier_stokes->super_AmrLevel).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo);
    if (lVar4 == 0) {
      __cxa_bad_cast();
    }
    pMVar2 = amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar4 + 0xd8));
    amrex::single_level_weighted_redistribute
              ((MultiFab *)&local_758,visc_terms,pMVar2,0,3,
               &(this->navier_stokes->super_AmrLevel).geom);
    amrex::MultiFab::~MultiFab(&local_1b0);
    amrex::MultiFab::~MultiFab((MultiFab *)&local_758);
  }
  return;
}

Assistant:

void
Diffusion::getTensorViscTerms (MultiFab&              visc_terms,
                               Real                   time,
                               const MultiFab* const* beta,
                               const MultiFab* const  betaCC,
                               int                    betaComp)
{
    int allthere;
    checkBeta(beta, allthere);

    const int src_comp = Xvel;
    const int ncomp    = visc_terms.nComp();

    if (ncomp < AMREX_SPACEDIM)
        amrex::Abort("Diffusion::getTensorViscTerms(): visc_terms needs at least BL_SPACEDIM components");
    //
    // Before computing the godunov predicitors we may have to
    // precompute the viscous source terms.  To do this we must
    // construct a Laplacian operator, set the coeficients and apply
    // it to the time N data.  First, however, we must precompute the
    // fine N bndry values.  We will do this for each scalar that diffuses.
    //
    // Note: This routine DOES NOT fill grow cells
    //
    MultiFab&   S    = navier_stokes->get_data(State_Type,time);

    if (is_diffusive[src_comp])
    {
        int ng = 1;
        MultiFab visc_tmp(grids,dmap,AMREX_SPACEDIM,2,MFInfo(),navier_stokes->Factory()),
                 s_tmp(grids,dmap,AMREX_SPACEDIM,ng,MFInfo(),navier_stokes->Factory());
        visc_tmp.setVal(0.);
        MultiFab::Copy(s_tmp,S,Xvel,0,AMREX_SPACEDIM,0);

        //
        // Set up operator and apply to compute viscous terms.
        //
        const Real a = 0.0;
        const Real b = -1.0;

        // MLMG tensor solver
        {
           LPInfo info;
           info.setAgglomeration(agglomeration);
           info.setConsolidation(consolidation);
           info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
           const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
           MLEBTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
           MLTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info);
#endif
           tensorop.setMaxOrder(tensor_max_order);

           // create right container
           Array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc[AMREX_SPACEDIM];
           Array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc[AMREX_SPACEDIM];
           // fill it
           for (int i=0; i<AMREX_SPACEDIM; i++)
             setDomainBC(mlmg_lobc[i], mlmg_hibc[i], Xvel+i);
           // pass to op
           tensorop.setDomainBC({AMREX_D_DECL(mlmg_lobc[0],mlmg_lobc[1],mlmg_lobc[2])},
                                {AMREX_D_DECL(mlmg_hibc[0],mlmg_hibc[1],mlmg_hibc[2])});

           // set coarse-fine BCs
           {
              MultiFab crsedata;

              if (level > 0) {
                auto& crse_ns = *(coarser->navier_stokes);
                crsedata.define(crse_ns.boxArray(), crse_ns.DistributionMap(),
                                AMREX_SPACEDIM, ng, MFInfo(),crse_ns.Factory());
                AmrLevel::FillPatch(crse_ns, crsedata, ng, time, State_Type, Xvel,
                                    AMREX_SPACEDIM);
                tensorop.setCoarseFineBC(&crsedata, crse_ratio[0]);
              }
              AmrLevel::FillPatch(*navier_stokes,s_tmp,ng,time,State_Type,Xvel,AMREX_SPACEDIM);
              tensorop.setLevelBC(0, &s_tmp);

              // FIXME: check divergence of vel
              // MLNodeLaplacian mllap({navier_stokes->Geom()}, {grids}, {dmap}, info);
              // mllap.setDomainBC(mlmg_lobc[0], mlmg_hibc[0]);
              // Rhs2.setVal(0.);
              // mllap.compDivergence({&Rhs2}, {&s_tmp});
              // amrex::WriteSingleLevelPlotfile("div_"+std::to_string(count), Rhs2, {AMREX_D_DECL("x","y","z")},navier_stokes->Geom(), 0.0, 0);
              //
           }

           tensorop.setScalars(a, b);

#ifdef AMREX_USE_EB
           setViscosity(tensorop, beta, betaComp, *betaCC);
#else
           amrex::ignore_unused(betaCC);
           setViscosity(tensorop, beta, betaComp);
#endif

           MLMG mlmg(tensorop);
           // FIXME -- consider making new parameters max_iter and bottom_verbose
           //mlmg.setMaxIter(max_iter);
           mlmg.setMaxFmgIter(max_fmg_iter);
           mlmg.setVerbose(10);
           mlmg.setBottomVerbose(10);
           //mlmg.setBottomVerbose(bottom_verbose);

           mlmg.apply({&visc_tmp}, {&s_tmp});
        }

#ifdef AMREX_USE_EB
        const amrex::MultiFab* weights;
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
        weights = &(ebfactory.getVolFrac());
        amrex::single_level_weighted_redistribute(visc_tmp, visc_terms, *weights, 0, AMREX_SPACEDIM,
                                                  navier_stokes->Geom() );
#else
        MultiFab::Copy(visc_terms,visc_tmp,0,0,AMREX_SPACEDIM,0);
#endif
    }
    else
    {
        int ngrow = visc_terms.nGrow();
        visc_terms.setVal(0.0,src_comp,AMREX_SPACEDIM,ngrow);
    }
}